

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O2

void __thiscall sophia_interface::LUPREP_checkFlavour(sophia_interface *this,int IP)

{
  int KF;
  int iVar1;
  int J_1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int J;
  long lVar5;
  sophia_interface *psVar6;
  sophia_interface *CHMESS;
  sophia_interface *CHMESS_00;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int *piVar10;
  double dVar11;
  undefined1 local_a8 [64];
  double dStack_68;
  double DPS [5];
  int local_38;
  allocator local_31;
  
  DPS[1] = 0.0;
  DPS[2] = 0.0;
  dStack_68 = 0.0;
  DPS[0] = 0.0;
  DPS[3] = 0.0;
  uVar7 = 1;
  if (1 < IP) {
    uVar7 = (ulong)(uint)IP;
  }
  piVar10 = (int *)((long)(this->P + -1) + (uVar7 * 2 + 0x1f3e) * 4);
  DPS[4] = 0.0;
  local_38 = 0;
  iVar9 = 0;
  psVar6 = this;
  for (lVar8 = uVar7 - 1; lVar8 < this->N; lVar8 = lVar8 + 1) {
    iVar1 = iVar9;
    if (0xfffffff5 < this->K[0][lVar8] - 0xbU) {
      KF = this->K[1][lVar8];
      iVar2 = LUCOMP(psVar6,KF);
      if (iVar2 != 0) {
        iVar3 = -KCHG[0][(long)iVar2 + 499];
        if (-1 < KF) {
          iVar3 = KCHG[0][(long)iVar2 + 499];
        }
        if (iVar3 != 0) {
          if (iVar3 != 2) {
            local_38 = local_38 + 1;
            DPS[4] = (double)(ulong)(uint)(SUB84(DPS[4],0) + iVar3);
            MSTJ[0x5c] = 1;
            dVar11 = ULMASS(psVar6,this->K[1][lVar8]);
            DPS[3] = dVar11 + DPS[3];
          }
          piVar4 = piVar10;
          for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
            DPS[lVar5 + -1] = *(double *)piVar4 + DPS[lVar5 + -1];
            piVar4 = piVar4 + 8000;
          }
          iVar1 = iVar9 + 1;
          if (this->K[0][lVar8] == 1) {
            CHMESS = (sophia_interface *)local_a8;
            CHMESS_00 = (sophia_interface *)(local_a8 + 0x20);
            if (iVar9 != 0) {
              if (((local_38 == 1) || (2 < local_38)) || (DPS[4]._0_4_ != 0)) {
                psVar6 = CHMESS;
                std::__cxx11::string::string
                          ((string *)CHMESS,"LUPREP: unphysical flavour combination",&local_31);
                LUERRM(psVar6,2,(string *)CHMESS);
                std::__cxx11::string::~string((string *)CHMESS);
                psVar6 = CHMESS;
              }
              dVar11 = PARJ[0x1f] * 0.9 + DPS[3];
              if (((DPS[2] * DPS[2] - dStack_68 * dStack_68) - DPS[0] * DPS[0]) - DPS[1] * DPS[1] <
                  dVar11 * dVar11) {
                psVar6 = CHMESS_00;
                std::__cxx11::string::string
                          ((string *)CHMESS_00,"LUPREP: too small mass in jet system",&local_31);
                LUERRM(psVar6,3,(string *)CHMESS_00);
                std::__cxx11::string::~string((string *)CHMESS_00);
                psVar6 = CHMESS_00;
              }
            }
            for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
              DPS[lVar5 + -1] = 0.0;
            }
            DPS[4] = 0.0;
            local_38 = 0;
            iVar1 = 0;
          }
        }
      }
    }
    iVar9 = iVar1;
    piVar10 = piVar10 + 2;
  }
  return;
}

Assistant:

void sophia_interface::LUPREP_checkFlavour(int IP) {
// Serves as a local function of LUPREP. Solves goto->320 statement.
// When this function is called, LUPREP returns.
    // Check flavours and invariant masses in parton systems.
    int NP = 0;
    int KFN = 0;
    int KQS = 0;
    double DPS[5] = {0., 0., 0., 0., 0.};
    for (int I = std::max(1, IP) - 1; I < N; ++I) {
        if (K[0][I] <= 0 || K[0][I] > 10) continue;
        int KC = LUCOMP(K[1][I]);
        if (KC == 0) continue;
        int sgn = (K[1][I] < 0)? -1 : 1;
        int KQ = KCHG[1][KC - 1] * sgn;
        if (KQ == 0) continue;
        NP++;
        if (KQ != 2) {
            KFN++;
            KQS += KQ;
            MSTJ[92] = 1;
            DPS[4] += ULMASS(K[1][I]);
        }
        for (int J = 0; J < 4; ++J) {
            DPS[J] += P[J][I];
        }
        if (K[0][I] == 1) {
            if (NP != 1 && (KFN == 1 || KFN >= 3 || KQS != 0)) LUERRM(2, "LUPREP: unphysical flavour combination");
            if (NP != 1 && DPS[3] * DPS[3] - DPS[0] * DPS[0] - DPS[1] * DPS[1] - DPS[2] * DPS[2] < std::pow(0.9 * PARJ[31] + DPS[4], 2)) LUERRM(3, "LUPREP: too small mass in jet system");
            NP = 0;
            KFN = 0;
            KQS = 0;
            for (int J = 0; J < 5; ++J) {
                DPS[J] = 0.;
            }
        }
    }
    return;
}